

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

void __thiscall
HighsMipSolverData::startAnalyticCenterComputation(HighsMipSolverData *this,TaskGroup *taskGroup)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  uint uVar3;
  uint32_t uVar4;
  HighsSplitDeque *this_00;
  element_type *peVar5;
  ulong uVar6;
  anon_class_8_1_8991fb9c_for_functor local_10;
  
  this_00 = taskGroup->workerDeque;
  uVar3 = (this_00->ownerData).head;
  uVar6 = (ulong)uVar3;
  local_10.this = this;
  if (uVar6 < 0x2000) {
    (this_00->ownerData).head = uVar3 + 1;
    (this_00->taskArray)._M_elems[uVar6].metadata.stealer.super___atomic_base<unsigned_long>._M_i =
         0;
    *(undefined ***)(this_00->taskArray)._M_elems[uVar6].taskData = &PTR_operator___00448fb8;
    *(HighsMipSolverData **)((this_00->taskArray)._M_elems[uVar6].taskData + 8) = this;
    if ((this_00->ownerData).allStolenCopy != true) {
      HighsSplitDeque::growShared(this_00);
      return;
    }
    uVar4 = (this_00->ownerData).head;
    (this_00->stealerData).ts.super___atomic_base<unsigned_long>._M_i = CONCAT44(uVar4 - 1,uVar4);
    (this_00->stealerData).allStolen._M_base._M_i = false;
    (this_00->ownerData).splitCopy = (this_00->ownerData).head;
    (this_00->ownerData).allStolenCopy = false;
    if (((this_00->splitRequest)._M_base._M_i & 1U) != 0) {
      (this_00->splitRequest)._M_base._M_i = false;
    }
    peVar5 = (this_00->ownerData).workerBunk.
             super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LOCK();
    _Var2._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
    (peVar5->haveJobs).super___atomic_base<int>._M_i =
         (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (_Var2._M_i < (this_00->ownerData).numWorkers + -1) {
      HighsSplitDeque::WorkerBunk::publishWork
                ((this_00->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 this_00);
      return;
    }
  }
  else {
    if (((this_00->ownerData).splitCopy < 0x2000) && ((this_00->ownerData).allStolenCopy == false))
    {
      HighsSplitDeque::growShared(this_00);
    }
    puVar1 = &(this_00->ownerData).head;
    *puVar1 = *puVar1 + 1;
    HighsTask::
    Callable<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsMipSolverData.cpp:296:19)>
    ::anon_class_8_1_8991fb9c_for_functor::operator()(&local_10);
  }
  return;
}

Assistant:

void HighsMipSolverData::startAnalyticCenterComputation(
    const highs::parallel::TaskGroup& taskGroup) {
  taskGroup.spawn([&]() {
    // first check if the analytic centre computation should be cancelled, e.g.
    // due to early return in the root node evaluation
    Highs ipm;
    ipm.setOptionValue("solver", "ipm");
    ipm.setOptionValue("run_crossover", kHighsOffString);
    ipm.setOptionValue("presolve", kHighsOffString);
    ipm.setOptionValue("output_flag", false);
    // ipm.setOptionValue("output_flag", !mipsolver.submip);
    ipm.setOptionValue("ipm_iteration_limit", 200);
    HighsLp lpmodel(*mipsolver.model_);
    lpmodel.col_cost_.assign(lpmodel.num_col_, 0.0);
    ipm.passModel(std::move(lpmodel));

    //    if (!mipsolver.submip) {
    //      const std::string file_name = mipsolver.model_->model_name_ +
    //      "_ipm.mps"; printf("Calling ipm.writeModel(%s)\n",
    //      file_name.c_str()); fflush(stdout); ipm.writeModel(file_name);
    //    }

    mipsolver.analysis_.mipTimerStart(kMipClockIpmSolveLp);
    ipm.run();
    mipsolver.analysis_.mipTimerStop(kMipClockIpmSolveLp);
    const std::vector<double>& sol = ipm.getSolution().col_value;
    if (HighsInt(sol.size()) != mipsolver.numCol()) return;
    analyticCenterStatus = ipm.getModelStatus();
    analyticCenter = sol;
  });
}